

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.cpp
# Opt level: O0

SpanContext *
jaegertracing::SpanContext::fromStream(SpanContext *__return_storage_ptr__,istream *in)

{
  bool bVar1;
  long *plVar2;
  size_t kMaxByteChars;
  string buffer;
  size_t kMaxUInt64Chars;
  char ch;
  undefined1 local_c8 [8];
  SpanContext spanContext;
  istream *in_local;
  
  spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)in;
  SpanContext((SpanContext *)local_c8);
  spanContext._0_16_ =
       TraceID::fromStream((istream *)
                           spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next);
  bVar1 = TraceID::isValid((TraceID *)&spanContext);
  if (bVar1) {
    plVar2 = (long *)std::istream::get((char *)spanContext._mutex.super___mutex_base._M_mutex.__data
                                               .__list.__next);
    std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    SpanContext(__return_storage_ptr__);
  }
  else {
    SpanContext(__return_storage_ptr__);
  }
  ~SpanContext((SpanContext *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

SpanContext SpanContext::fromStream(std::istream& in)
{
    SpanContext spanContext;
    spanContext._traceID = TraceID::fromStream(in);
    if (!spanContext._traceID.isValid()) {
        return SpanContext();
    }

    char ch = '\0';
    if (!in.get(ch) || ch != ':') {
        return SpanContext();
    }

    constexpr auto kMaxUInt64Chars = static_cast<size_t>(16);
    auto buffer = utils::HexParsing::readSegment(in, kMaxUInt64Chars, ':');
    if (buffer.empty()) {
        return SpanContext();
    }
    spanContext._spanID = utils::HexParsing::decodeHex<uint64_t>(buffer);

    if (!in.get(ch) || ch != ':') {
        return SpanContext();
    }

    buffer = utils::HexParsing::readSegment(in, kMaxUInt64Chars, ':');
    if (buffer.empty()) {
        return SpanContext();
    }
    spanContext._parentID = utils::HexParsing::decodeHex<uint64_t>(buffer);

    if (!in.get(ch) || ch != ':') {
        return SpanContext();
    }

    constexpr auto kMaxByteChars = static_cast<size_t>(2);
    buffer = utils::HexParsing::readSegment(in, kMaxByteChars, ':');
    if (buffer.empty()) {
        return SpanContext();
    }
    spanContext._flags = utils::HexParsing::decodeHex<unsigned char>(buffer);

    in.clear();
    return spanContext;
}